

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

void __thiscall soul::AST::Block::performLocalNameSearch(Block *this)

{
  Statement *in_RDX;
  NameSearch *in_RSI;
  
  performLocalNameSearch((Block *)&this[-1].super_Scope,in_RSI,in_RDX);
  return;
}

Assistant:

void performLocalNameSearch (NameSearch& search, const Statement* statementToSearchUpTo) const override
        {
            if (search.findVariables)
            {
                auto name = search.partiallyQualifiedPath.getLastPart();
                pool_ptr<VariableDeclaration> lastMatch;

                for (auto& s : statements)
                {
                    if (s.getPointer() == statementToSearchUpTo)
                        break;

                    if (auto v = cast<VariableDeclaration> (s))
                        if (v->name == name)
                            lastMatch = v;
                }

                if (lastMatch != nullptr)
                    search.addResult (*lastMatch);
            }
        }